

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_Constructor_Test::TestBody(ElementsAddressFactory_Constructor_Test *this)

{
  bool bVar1;
  ElementsAddressFactory factory;
  AssertHelper local_58;
  Message local_50 [4];
  ElementsAddressFactory *in_stack_ffffffffffffffd0;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_ffffffffffffffd0);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f4bef);
    }
  }
  else {
    testing::Message::Message(local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x20,
               "Expected: ElementsAddressFactory factory doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x1f4c74);
  }
  return;
}

Assistant:

TEST(ElementsAddressFactory, Constructor)
{
  EXPECT_NO_THROW(ElementsAddressFactory factory);
}